

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QObject>_>::reallocate
          (QMovableArrayOps<QPointer<QObject>_> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QPointer<QObject>_>_*,_QPointer<QObject>_*> pVar1;
  
  pVar1 = QTypedArrayData<QPointer<QObject>_>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QPointer<QObject>_>).
                     super_QArrayDataPointer<QPointer<QObject>_>.d,
                     (this->super_QGenericArrayOps<QPointer<QObject>_>).
                     super_QArrayDataPointer<QPointer<QObject>_>.ptr,alloc,option);
  (this->super_QGenericArrayOps<QPointer<QObject>_>).super_QArrayDataPointer<QPointer<QObject>_>.d =
       pVar1.first;
  (this->super_QGenericArrayOps<QPointer<QObject>_>).super_QArrayDataPointer<QPointer<QObject>_>.ptr
       = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }